

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O0

void Qentem::Memory::Swap<Qentem::HAItem_T<Qentem::String<char16_t>,Qentem::Value<char16_t>>>
               (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *item1,
               HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *item2)

{
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *pHVar1;
  undefined1 local_48 [8];
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> item;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *item2_local;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *item1_local;
  
  item.Value._16_8_ = item2;
  pHVar1 = Move<Qentem::HAItem_T<Qentem::String<char16_t>,Qentem::Value<char16_t>>>(item1);
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::HAItem_T
            ((HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)local_48,pHVar1);
  pHVar1 = Move<Qentem::HAItem_T<Qentem::String<char16_t>,Qentem::Value<char16_t>>>
                     ((HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)
                      item.Value._16_8_);
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator=(item1,pHVar1);
  pHVar1 = Move<Qentem::HAItem_T<Qentem::String<char16_t>,Qentem::Value<char16_t>>>
                     ((HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)local_48);
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator=
            ((HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)item.Value._16_8_,
             pHVar1);
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::~HAItem_T
            ((HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)local_48);
  return;
}

Assistant:

inline static void Swap(Type_T &item1, Type_T &item2) noexcept {
    Type_T item = Move(item1);
    item1       = Move(item2);
    item2       = Move(item);
}